

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

PClass * __thiscall PClass::CreateDerivedClass(PClass *this,FName *name,uint size)

{
  PClass *pPVar1;
  bool bVar2;
  int iVar3;
  size_t in_RAX;
  PClassActor *pPVar4;
  undefined4 extraout_var;
  PClassActor *this_00;
  PClassActor *pPVar5;
  PClassActor *pPVar6;
  PClass *pPVar7;
  PType **ppPVar8;
  ulong uVar9;
  size_t bucket;
  size_t local_38;
  
  if (size < *(uint *)&(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                       super_DObject.field_0x24) {
    __assert_fail("size >= Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                  ,0xc9f,"PClass *PClass::CreateDerivedClass(FName, unsigned int)");
  }
  bVar2 = false;
  local_38 = in_RAX;
  pPVar4 = (PClassActor *)
           FTypeTable::FindType(&TypeTable,RegistrationInfo.MyClass,0,(long)name->Index,&local_38);
  if (pPVar4 != (PClassActor *)0x0) {
    if (*(int *)&(pPVar4->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.
                 super_PType.super_DObject.field_0x24 == -1) {
      pPVar1 = (pPVar4->super_PClass).ParentClass;
      pPVar7 = this;
      if (pPVar1 != this) {
        do {
          pPVar7 = pPVar7->ParentClass;
          if (pPVar7 == pPVar1) break;
        } while (pPVar7 != (PClass *)0x0);
        if (pPVar7 == (PClass *)0x0) {
          I_Error("%s must inherit from %s but doesn\'t.",
                  FName::NameData.NameArray[name->Index].Text,
                  FName::NameData.NameArray[(pPVar1->super_PStruct).super_PNamedType.TypeName.Index]
                  .Text);
        }
      }
      DPrintf(4,"Defining placeholder class %s\n",FName::NameData.NameArray[name->Index].Text);
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  if ((this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.Class ==
      (PClass *)0x0) {
    iVar3 = (**(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.
               _vptr_DObject)(this);
    (this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.Class =
         (PClass *)CONCAT44(extraout_var,iVar3);
  }
  this_00 = (PClassActor *)
            CreateNew((this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                      super_DObject.Class);
  (this_00->super_PClass).super_PStruct.super_PNamedType.TypeName.Index = name->Index;
  *(uint *)&(this_00->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
            super_DObject.field_0x24 = size;
  (this_00->super_PClass).bRuntimeClass = true;
  (*(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.
    _vptr_DObject[0x16])(this,this_00);
  (*(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.
    _vptr_DObject[0x17])(this,this_00);
  if (bVar2) {
    if (PClassActor::AllActorClasses.Count != 0) {
      PClassActor::AllActorClasses.Count = PClassActor::AllActorClasses.Count - 1;
    }
    if (PClassActor::AllActorClasses.Count != 0) {
      uVar9 = 0;
      do {
        (**(code **)((long)(PClassActor::AllActorClasses.Array[uVar9]->super_PClass).super_PStruct.
                           super_PNamedType.super_PCompoundType.super_PType.super_DObject.
                           _vptr_DObject + 0xc0))
                  (PClassActor::AllActorClasses.Array[uVar9],pPVar4,this_00);
        if (PClassActor::AllActorClasses.Array[uVar9] == pPVar4) {
          PClassActor::AllActorClasses.Array[uVar9] = this_00;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < PClassActor::AllActorClasses.Count);
    }
    pPVar6 = (PClassActor *)TypeTable.TypeHash[local_38];
    if (pPVar6 != (PClassActor *)0x0) {
      if (pPVar6 == pPVar4) {
        ppPVar8 = TypeTable.TypeHash + local_38;
      }
      else {
        do {
          pPVar5 = pPVar6;
          pPVar6 = (PClassActor *)
                   (pPVar5->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.
                   super_PType.HashNext;
          if (pPVar6 == (PClassActor *)0x0) {
            return &this_00->super_PClass;
          }
        } while (pPVar6 != pPVar4);
        ppPVar8 = &(pPVar5->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.
                   super_PType.HashNext;
      }
      (this_00->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
      HashNext = (pPVar6->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.
                 super_PType.HashNext;
      (pPVar6->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.HashNext
           = (PType *)0x0;
      *ppPVar8 = (PType *)this_00;
    }
  }
  else {
    InsertIntoHash((PClass *)this_00);
  }
  return &this_00->super_PClass;
}

Assistant:

PClass *PClass::CreateDerivedClass(FName name, unsigned int size)
{
	assert (size >= Size);
	PClass *type;
	bool notnew;
	size_t bucket;

	PClass *existclass = static_cast<PClass *>(TypeTable.FindType(RUNTIME_CLASS(PClass), /*FIXME:Outer*/0, name, &bucket));

	// This is a placeholder so fill it in
	if (existclass != NULL && (existclass->Size == TentativeClass))
	{
		type = const_cast<PClass*>(existclass);
		if (!IsDescendantOf(type->ParentClass))
		{
			I_Error("%s must inherit from %s but doesn't.", name.GetChars(), type->ParentClass->TypeName.GetChars());
		}
		DPrintf(DMSG_SPAMMY, "Defining placeholder class %s\n", name.GetChars());
		notnew = true;
	}
	else
	{
		notnew = false;
	}

	// Create a new type object of the same type as us. (We may be a derived class of PClass.)
	type = static_cast<PClass *>(GetClass()->CreateNew());

	type->TypeName = name;
	type->Size = size;
	type->bRuntimeClass = true;
	Derive(type);
	DeriveData(type);
	if (!notnew)
	{
		type->InsertIntoHash();
	}
	else
	{
		PClassActor::AllActorClasses.Pop();	// remove the newly added class from the list
		// todo: replace all affected fields
		for (unsigned i = 0; i < PClassActor::AllActorClasses.Size(); i++)
		{
			PClassActor::AllActorClasses[i]->ReplaceClassRef(existclass, type);
			if (PClassActor::AllActorClasses[i] == existclass)
				PClassActor::AllActorClasses[i] = static_cast<PClassActor*>(type);
		}
		TypeTable.ReplaceType(type, existclass, bucket);
	}
	return type;
}